

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O2

void Rsb_DecPrintTable(word *pCexes,int nGs,int nGsAll,Vec_Int_t *vTries)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  int pCands [16];
  
  if (vTries->nSize == 0) {
    return;
  }
  iVar3 = 4;
  while (bVar11 = iVar3 != 0, iVar3 = iVar3 + -1, bVar11) {
    printf("    ");
  }
  printf("  ");
  if (nGs < 1) {
    nGs = 0;
  }
  uVar7 = 0;
  uVar5 = nGs;
  while( true ) {
    bVar11 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar11) break;
    printf("%d",(ulong)((byte)((char)uVar7 + (char)((ulong)uVar7 / 100) * -100) / 10),
           (ulong)uVar7 % 100);
    uVar7 = uVar7 + 1;
  }
  putchar(0x7c);
  uVar5 = nGs;
  while( true ) {
    if (nGsAll <= (int)uVar5) break;
    printf("%d",(ulong)((byte)((char)uVar5 + (char)((ulong)uVar5 / 100) * -100) / 10),
           (ulong)uVar5 % 100);
    uVar5 = uVar5 + 1;
  }
  putchar(10);
  iVar3 = 4;
  while (bVar11 = iVar3 != 0, iVar3 = iVar3 + -1, bVar11) {
    printf("    ");
  }
  printf("  ");
  uVar7 = 0;
  uVar5 = nGs;
  while( true ) {
    bVar11 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar11) break;
    printf("%d",(ulong)uVar7 % 10);
    uVar7 = uVar7 + 1;
  }
  putchar(0x7c);
  for (uVar5 = nGs; (int)uVar5 < nGsAll; uVar5 = uVar5 + 1) {
    printf("%d",(ulong)uVar5 % 10);
  }
  putchar(10);
  putchar(10);
  lVar6 = (long)nGsAll;
  uVar4 = (ulong)(uint)nGs;
  uVar10 = 0;
  iVar3 = 0;
  do {
    iVar1 = vTries->nSize;
    if (iVar1 <= iVar3) {
      putchar(10);
      iVar3 = 4;
      while (bVar11 = iVar3 != 0, iVar3 = iVar3 + -1, bVar11) {
        printf("    ");
      }
      printf("  ");
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        iVar3 = Abc_TtCountOnes(pCexes[uVar10]);
        printf("%d",(ulong)(byte)(((ushort)iVar3 & 0xff) / 10));
      }
      putchar(0x7c);
      for (uVar10 = uVar4; (long)uVar10 < lVar6; uVar10 = uVar10 + 1) {
        iVar3 = Abc_TtCountOnes(pCexes[uVar10]);
        printf("%d",(ulong)(byte)(((ushort)iVar3 & 0xff) / 10));
      }
      putchar(10);
      iVar3 = 4;
      while (bVar11 = iVar3 != 0, iVar3 = iVar3 + -1, bVar11) {
        printf("    ");
      }
      printf("  ");
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        iVar3 = Abc_TtCountOnes(pCexes[uVar10]);
        printf("%d",(char)(((ushort)iVar3 & 0xff) % 10));
      }
      putchar(0x7c);
      for (; (long)uVar4 < lVar6; uVar4 = uVar4 + 1) {
        iVar3 = Abc_TtCountOnes(pCexes[uVar4]);
        printf("%d",(char)(((ushort)iVar3 & 0xff) % 10));
      }
      putchar(10);
      putchar(10);
      return;
    }
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      pCands[lVar2] = -1;
    }
    lVar2 = 0;
    while( true ) {
      uVar5 = (uint)lVar2;
      if (iVar1 <= (int)(iVar3 + uVar5)) break;
      iVar1 = Vec_IntEntry(vTries,iVar3 + uVar5);
      if (iVar1 == -1) {
        iVar3 = iVar3 + uVar5 + 1;
        break;
      }
      pCands[lVar2] = iVar1;
      lVar2 = lVar2 + 1;
      iVar1 = vTries->nSize;
    }
    if (4 < uVar5) {
      __assert_fail("nCands <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/rsb/rsbDec6.c"
                    ,0xef,"void Rsb_DecPrintTable(word *, int, int, Vec_Int_t *)");
    }
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      if (pCands[lVar2] < 0) {
        printf("    ");
      }
      else {
        printf("%4d");
      }
    }
    printf("  ");
    uVar8 = 1L << ((byte)uVar10 & 0x3f);
    for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
      putchar((uint)((pCexes[(uVar10 >> 6) + uVar9] & uVar8) != 0) * 3 + 0x2b);
    }
    putchar(0x7c);
    for (uVar9 = uVar4; (long)uVar9 < lVar6; uVar9 = uVar9 + 1) {
      putchar((uint)((pCexes[(uVar10 >> 6) + uVar9] & uVar8) != 0) * 3 + 0x2b);
    }
    printf("  %3d\n",uVar10 & 0xffffffff);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void Rsb_DecPrintTable( word * pCexes, int nGs, int nGsAll, Vec_Int_t * vTries ) 
{
    int pCands[16], nCands;
    int i, c, Cand, iStart = 0;
    if ( Vec_IntSize(vTries) == 0 )
        return;

//    printf( "\n" );
    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", (i % 100) / 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", (i % 100) / 10 );
    printf( "\n" );

    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", i % 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", i % 10 );
    printf( "\n" );
    printf( "\n" );

    for ( c = 0; iStart < Vec_IntSize(vTries); c++ )
    {
        // collect candidates
        for ( i = 0; i < 4; i++ )
            pCands[i] = -1;
        nCands = 0;
        Vec_IntForEachEntryStart( vTries, Cand, i, iStart )
            if ( Cand == -1 )
            {
                iStart = i + 1;
                break;
            }
            else
                pCands[nCands++] = Cand;
        assert( nCands <= 4 );
        // print them
        for ( i = 0; i < 4; i++ )
            if ( pCands[i] >= 0 )
                printf( "%4d", pCands[i] );
            else
                printf( "    " );
        // print the bit-string
        printf( "  " );
        for ( i = 0; i < nGs; i++ )
            printf( "%c", Abc_TtGetBit( pCexes + i, c ) ? '.' : '+' );
        printf( "|" );
        for ( ; i < nGsAll; i++ )
            printf( "%c", Abc_TtGetBit( pCexes + i, c ) ? '.' : '+' );
        printf( "  %3d\n", c );
    }
    printf( "\n" );

    // write the number of ones
    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) / 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) / 10 );
    printf( "\n" );

    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) % 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) % 10 );
    printf( "\n" );
    printf( "\n" );
}